

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# physfs_archiver_7z.c
# Opt level: O1

void SZIP_global_init(void)

{
  uint *puVar1;
  uint uVar2;
  uint uVar3;
  ulong uVar4;
  long lVar5;
  int iVar6;
  uint uVar7;
  uint uVar8;
  ulong uVar9;
  UInt32 *pUVar10;
  uint uVar11;
  long lVar12;
  bool bVar13;
  
  if (SZIP_global_init_generatedTable != '\0') {
    return;
  }
  SZIP_global_init_generatedTable = 1;
  uVar4 = 0;
  do {
    iVar6 = 8;
    uVar9 = uVar4 & 0xffffffff;
    do {
      uVar8 = -((uint)uVar9 & 1) & 0xedb88320 ^ (uint)(uVar9 >> 1);
      uVar9 = (ulong)uVar8;
      iVar6 = iVar6 + -1;
    } while (iVar6 != 0);
    g_CrcTable[uVar4] = uVar8;
    uVar4 = uVar4 + 1;
  } while (uVar4 != 0x100);
  lVar5 = 0x100;
  do {
    uVar8 = *(uint *)((long)&_DYNAMIC[0x12].d_val + lVar5 * 4);
    g_CrcTable[lVar5] = uVar8 >> 8 ^ g_CrcTable[uVar8 & 0xff];
    lVar5 = lVar5 + 1;
  } while (lVar5 != 0x800);
  g_CrcUpdate = CrcUpdateT4;
  lVar12 = 0;
  lVar5 = cpuid_basic_info(0);
  puVar1 = (uint *)cpuid_Version_info(1);
  uVar8 = *puVar1;
  uVar3 = uVar8 >> 8 & 0xf | uVar8 >> 0x10 & 0xff0;
  uVar7 = uVar8 >> 0xc & 0xf0;
  uVar2 = uVar8 >> 4 & 0xf | uVar7;
  pUVar10 = kVendors[0] + 2;
  uVar11 = uVar7;
  do {
    bVar13 = true;
    if ((((*(UInt32 (*) [3])(pUVar10 + -2))[0] == *(UInt32 *)(lVar5 + 4)) &&
        (pUVar10[-1] == *(UInt32 *)(lVar5 + 8))) && (*pUVar10 == *(UInt32 *)(lVar5 + 0xc))) {
      bVar13 = false;
      uVar11 = (uint)lVar12;
    }
    if (!bVar13) goto LAB_0010d187;
    lVar12 = lVar12 + 1;
    pUVar10 = pUVar10 + 3;
  } while (lVar12 != 3);
  uVar11 = 0xffffffff;
LAB_0010d187:
  if (uVar11 == 2) {
    bVar13 = uVar2 < 0xf && uVar3 == 6;
  }
  else {
    if (uVar11 != 1) {
      if (uVar11 != 0) {
        return;
      }
      if (uVar3 < 6) {
        return;
      }
      if (uVar3 == 6) {
        if ((uVar8 >> 4 & 0xe | uVar7) == 0x26) {
          return;
        }
        if ((uVar2 < 0x37) && ((0x60000010000000U >> ((ulong)uVar2 & 0x3f) & 1) != 0)) {
          return;
        }
      }
      goto LAB_0010d1eb;
    }
    if (uVar3 < 5) {
      return;
    }
    if (uVar3 != 5) goto LAB_0010d1eb;
    bVar13 = uVar2 == 10;
    uVar3 = uVar2;
  }
  if ((bool)(bVar13 | uVar3 < 6)) {
    return;
  }
LAB_0010d1eb:
  g_CrcUpdate = CrcUpdateT8;
  return;
}

Assistant:

void SZIP_global_init(void)
{
    /* this just needs to calculate some things, so it only ever
       has to run once, even after a deinit. */
    static int generatedTable = 0;
    if (!generatedTable)
    {
        generatedTable = 1;
        CrcGenerateTable();
    } /* if */
}